

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::AggregationPS::execute
          (AggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  VarStatus VVar1;
  type_conflict5 tVar2;
  bool bVar3;
  int iVar4;
  VarStatus *pVVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  char *pcVar7;
  ostream *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  ulong *puVar9;
  string *m;
  int __c;
  int __c_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_stack_00000008;
  byte in_stack_00000010;
  int k_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  int k;
  int active_idx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff1f8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff200;
  allocator *this_01;
  double in_stack_fffffffffffff208;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff210;
  cpp_dec_float<50U,_int,_void> *this_02;
  undefined5 in_stack_fffffffffffff218;
  undefined1 in_stack_fffffffffffff21d;
  type_conflict5 tVar11;
  undefined1 in_stack_fffffffffffff21e;
  undefined1 in_stack_fffffffffffff21f;
  bool bVar12;
  undefined4 in_stack_fffffffffffff230;
  uint uVar13;
  undefined4 in_stack_fffffffffffff234;
  undefined7 in_stack_fffffffffffff240;
  char cVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff270;
  undefined4 in_stack_fffffffffffff278;
  VarStatus in_stack_fffffffffffff27c;
  undefined4 in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff28c;
  allocator local_d61;
  string local_d60 [32];
  ulong local_d40;
  undefined1 local_d38 [40];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff2f8;
  undefined1 local_d00 [56];
  undefined1 local_cc8 [56];
  undefined1 local_c90 [56];
  undefined1 local_c58 [56];
  undefined1 local_c20 [56];
  undefined1 local_be8 [56];
  undefined1 local_bb0 [56];
  undefined8 local_b78;
  undefined1 local_b70 [56];
  undefined1 local_b38 [56];
  undefined1 local_b00 [56];
  undefined1 local_ac8 [56];
  undefined1 local_a90 [56];
  undefined1 local_a58 [56];
  undefined8 local_a20;
  undefined1 local_a14 [56];
  undefined1 local_9dc [56];
  undefined1 local_9a4 [56];
  uint local_96c;
  undefined8 local_968;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_960;
  undefined1 local_928 [56];
  undefined1 local_8f0 [56];
  undefined1 local_8b8 [56];
  undefined1 local_880 [56];
  undefined1 local_848 [56];
  undefined1 local_810 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7d8;
  undefined1 local_7a0 [56];
  undefined8 local_768;
  undefined1 local_760 [56];
  undefined1 local_728 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_680;
  undefined8 local_648;
  undefined8 local_640;
  undefined1 local_638 [56];
  undefined1 local_600 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c8;
  undefined1 local_590 [56];
  uint local_558;
  int local_554;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_550;
  undefined8 local_518;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_50c;
  byte local_4d1;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_4d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  undefined8 local_4a0;
  undefined8 *local_498;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_490;
  undefined8 local_488;
  undefined8 *local_480;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined1 *local_460;
  undefined8 local_458;
  ulong *local_450;
  undefined1 *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined1 *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  undefined1 *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  undefined1 *local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_410;
  undefined1 *local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_400;
  undefined1 *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  undefined1 *local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3e0;
  undefined1 *local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d0;
  undefined1 *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined1 *local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  undefined1 *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  undefined1 *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  undefined1 *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  undefined1 *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  undefined1 *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined1 *local_340;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  undefined1 *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  undefined1 *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  ulong *local_2c0;
  undefined8 local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_299;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined1 *local_268;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_259;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_219;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1d9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_199;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_159;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_119;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined8 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined8 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_4d1 = in_stack_00000010 & 1;
  local_4d0 = in_R9;
  local_4b8 = in_RDX;
  if (*(int *)&(in_RDI->m_backend).neg != (in_RDI->m_backend).prec_elem) {
    in_stack_fffffffffffff268 =
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff200,(int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2c8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2d0 = in_stack_fffffffffffff268;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    in_stack_fffffffffffff270 =
         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff200,(int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2e0 = in_stack_fffffffffffff270;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,*(int *)&(in_RDI->m_backend).neg);
    in_stack_fffffffffffff27c = *pVVar5;
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](in_stack_00000008,(in_RDI->m_backend).prec_elem);
    *pVVar5 = in_stack_fffffffffffff27c;
  }
  if ((in_RDI->m_backend).exp != (in_RDI->m_backend).fpclass) {
    pnVar6 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff200,
                          (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2e8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2f0 = pnVar6;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    pnVar6 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff200,
                          (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_2f8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_300 = pnVar6;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_4d0,(in_RDI->m_backend).exp);
    VVar1 = *pVVar5;
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_4d0,(in_RDI->m_backend).fpclass);
    *pVVar5 = VVar1;
  }
  local_518 = 0;
  local_490 = &local_50c;
  local_498 = &local_518;
  local_4a0 = 0;
  local_2a8 = local_498;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_fffffffffffff21f,
                           CONCAT16(in_stack_fffffffffffff21e,
                                    CONCAT15(in_stack_fffffffffffff21d,in_stack_fffffffffffff218))),
               (int)((ulong)in_stack_fffffffffffff210 >> 0x20));
  local_554 = -1;
  uVar10 = extraout_RDX;
  for (local_558 = 0; (int)local_558 < 2; local_558 = local_558 + 1) {
    pcVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI[7].m_backend.data._M_elems + 2),(char *)(ulong)local_558,(int)uVar10
                    );
    uVar10 = extraout_RDX_00;
    if ((int)pcVar7 != (in_RDI->m_backend).exp) {
      pcVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI[7].m_backend.data._M_elems + 2),(char *)(ulong)local_558,
                       (int)extraout_RDX_00);
      local_554 = (int)pcVar7;
      pnVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)(in_RDI[7].m_backend.data._M_elems + 2),local_558);
      local_118 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffff200,
                               (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
      local_108 = local_590;
      local_110 = pnVar6;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_119,pnVar6,local_118);
      local_100 = local_590;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200);
      local_e8 = local_590;
      local_f0 = local_110;
      local_f8 = local_118;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (cpp_dec_float<50U,_int,_void> *)0x430470);
      local_318 = &local_50c;
      local_320 = local_590;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      uVar10 = extraout_RDX_01;
    }
  }
  local_440 = in_RDI + 6;
  local_438 = local_600;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_428 = local_638;
  local_430 = &local_50c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
  local_640 = 0x3ff0000000000000;
  tVar2 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff1f8,(double *)0x430570);
  if (tVar2) {
    local_648 = 0x3ff0000000000000;
    local_90 = &local_5c8;
    local_98 = &local_648;
    local_88 = local_98;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),(double)in_RDI);
  }
  local_1d0 = in_RDI + 6;
  local_1c8 = &local_6b8;
  local_1d8 = &local_5c8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_1d9,local_1d0,local_1d8);
  local_1c0 = &local_6b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_1a8 = &local_6b8;
  local_1b0 = local_1d0;
  local_1b8 = local_1d8;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x43068d);
  local_208 = &local_6f0;
  local_210 = &local_50c;
  local_218 = &local_5c8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_219,local_210,local_218);
  local_200 = &local_6f0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_1e8 = &local_6f0;
  local_1f0 = local_210;
  local_1f8 = local_218;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x430744);
  local_28 = &local_680;
  local_30 = &local_6b8;
  local_38 = &local_6f0;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30,local_38);
  local_20 = &local_680;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_8 = &local_680;
  local_10 = local_30;
  local_18 = local_38;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x4307fb);
  local_418 = local_728;
  local_420 = &local_680;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x38))(local_760);
  bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  if (bVar3) {
    local_768 = 0;
    local_a8 = &local_680;
    local_b0 = &local_768;
    local_a0 = local_b0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),(double)in_RDI);
  }
  local_148 = &local_7d8;
  local_150 = &local_680;
  local_158 = &local_5c8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_159,local_150,local_158);
  local_140 = &local_7d8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_128 = &local_7d8;
  local_130 = local_150;
  local_138 = local_158;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x43096d);
  local_248 = local_7a0;
  local_250 = &local_7d8;
  local_258 = &local_550;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_259,local_250,local_258);
  local_240 = local_7a0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_228 = local_7a0;
  local_230 = local_250;
  local_238 = local_258;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x430a24);
  local_328 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff200,
                           (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
  local_330 = local_7a0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  pnVar6 = in_RDI + 6;
  local_308 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff200,
                           (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
  local_310 = pnVar6;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  cVar14 = '\0';
  if ((local_4d1 & 1) != 0) {
    local_410 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_408 = local_810;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    local_400 = in_RDI + 2;
    local_3f8 = local_848;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_880);
    bVar3 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                       in_stack_fffffffffffff270);
    iVar4 = CONCAT13(1,(int3)in_stack_fffffffffffff234);
    if (!bVar3) {
      local_3f0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffff200,
                               (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
      local_3e8 = local_8b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      local_3e0 = in_RDI + 1;
      local_3d8 = local_8f0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_928);
      bVar3 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(cVar14,in_stack_fffffffffffff240),pnVar6,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(iVar4,in_stack_fffffffffffff230));
      iVar4 = (uint)bVar3 << 0x18;
    }
    cVar14 = (char)((uint)iVar4 >> 0x18);
  }
  if (cVar14 != '\0') {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "EMAISM: numerical violation after disaggregating variable");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_968 = 0;
  local_478 = &local_960;
  local_480 = &local_968;
  local_488 = 0;
  local_2b0 = local_480;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
  local_96c = 0;
  while (uVar13 = local_96c,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)&in_RDI[7].m_backend.exp), (int)uVar13 < iVar4) {
    pcVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)&in_RDI[7].m_backend.exp,(char *)(ulong)local_96c,__c);
    if ((int)pcVar7 != *(int *)&(in_RDI->m_backend).neg) {
      pnVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)&in_RDI[7].m_backend.exp,local_96c);
      pnVar6 = local_4b8;
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&in_RDI[7].m_backend.exp,(char *)(ulong)local_96c,__c_00);
      local_198 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffff200,
                               (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
      local_188 = local_9a4;
      local_190 = pnVar8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_199,pnVar8,local_198);
      local_180 = local_9a4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200);
      local_168 = local_9a4;
      local_170 = local_190;
      local_178 = local_198;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (cpp_dec_float<50U,_int,_void> *)0x430e55);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator+=(pnVar6,(self_type *)
                          CONCAT17(in_stack_fffffffffffff21f,
                                   CONCAT16(in_stack_fffffffffffff21e,
                                            CONCAT15(in_stack_fffffffffffff21d,
                                                     in_stack_fffffffffffff218))));
    }
    local_96c = local_96c + 1;
  }
  local_70 = in_RDI + 3;
  local_68 = local_9dc;
  local_78 = &local_960;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_79,local_70,local_78);
  local_60 = local_9dc;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_48 = local_9dc;
  local_50 = local_70;
  local_58 = local_78;
  boost::multiprecision::default_ops::
  eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x430f3f);
  local_338 = &local_680;
  local_340 = local_9dc;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_288 = local_a14;
  local_290 = &local_680;
  local_298 = &local_550;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_299,local_290,local_298);
  local_280 = local_a14;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200);
  local_268 = local_a14;
  local_270 = local_290;
  local_278 = local_298;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (cpp_dec_float<50U,_int,_void> *)0x43102b);
  local_348 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff200,
                           (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
  local_350 = local_a14;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_a20 = 0;
  local_c0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffff200,
                          (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
  local_c8 = &local_a20;
  local_b8 = local_c8;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),(double)in_RDI);
  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](local_4d0,local_554);
  if ((*pVVar5 == ON_UPPER) ||
     (pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_4d0,local_554), *pVVar5 == FIXED)) {
    local_3d0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_3c8 = local_a58;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    local_3c0 = in_RDI + 4;
    local_3b8 = local_a90;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_ac8);
    bVar3 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                       in_stack_fffffffffffff270);
    bVar12 = true;
    if (bVar3) goto LAB_004312c5;
  }
  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](local_4d0,local_554);
  if (*pVVar5 != ON_LOWER) {
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_4d0,local_554);
    bVar12 = false;
    if (*pVVar5 != FIXED) goto LAB_004312c5;
  }
  local_3b0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff200,
                           (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
  local_3a8 = local_b00;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  local_3a0 = in_RDI + 5;
  local_398 = local_b38;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
  (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_b70);
  bVar12 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                      in_stack_fffffffffffff270);
LAB_004312c5:
  if (bVar12 == false) {
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_4d0,(in_RDI->m_backend).exp);
    *pVVar5 = BASIC;
  }
  else {
    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
             ::operator[](local_4d0,local_554);
    *pVVar5 = BASIC;
    local_b78 = 0;
    local_d8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)in_stack_fffffffffffff200,
                            (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_e0 = &local_b78;
    local_d0 = local_e0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),(double)in_RDI);
    local_390 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff200,
                             (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    local_388 = local_bb0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    local_380 = in_RDI + 1;
    local_378 = local_be8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
    (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_c20);
    bVar3 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                       in_stack_fffffffffffff270);
    if (bVar3) {
      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](local_4d0,(in_RDI->m_backend).exp);
      *pVVar5 = ON_UPPER;
    }
    else {
      local_370 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)in_stack_fffffffffffff200,
                               (int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
      local_368 = local_c58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      local_360 = in_RDI + 2;
      local_358 = local_c90;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
      (**(code **)(*(long *)(in_RDI->m_backend).data._M_elems + 0x30))(local_cc8);
      bVar3 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278),
                         in_stack_fffffffffffff270);
      if (bVar3) {
        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_4d0,(in_RDI->m_backend).exp);
        *pVVar5 = ON_LOWER;
      }
      else {
        this_02 = &in_RDI[1].m_backend;
        local_468 = infinity();
        local_460 = local_d00;
        local_470 = 0;
        local_2b8 = local_468;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (this_02,in_stack_fffffffffffff208,in_stack_fffffffffffff200);
        tVar2 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff1f8,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x43157a);
        tVar11 = false;
        if (tVar2) {
          pnVar6 = in_RDI + 2;
          puVar9 = (ulong *)infinity();
          local_d40 = *puVar9 ^ 0x8000000000000000;
          local_448 = local_d38;
          local_450 = &local_d40;
          local_458 = 0;
          local_2c0 = local_450;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (this_02,(double)pnVar6,in_stack_fffffffffffff200);
          tVar11 = boost::multiprecision::operator<=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_fffffffffffff1f8,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x431631);
        }
        if (tVar11 == false) {
          m = (string *)__cxa_allocate_exception(0x28);
          this_01 = &local_d61;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d60,"XMAISM unexpected basis status in aggregation unsimplifier.",this_01
                    );
          SPxInternalCodeException::SPxInternalCodeException((SPxInternalCodeException *)this_01,m);
          __cxa_throw(m,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_4d0,(in_RDI->m_backend).exp);
        *pVVar5 = ZERO;
      }
    }
  }
  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
           ::operator[](in_stack_00000008,*(int *)&(in_RDI->m_backend).neg);
  *pVVar5 = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}